

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool kwssys::SystemTools::FileHasSignature(char *filename,char *signature,long offset)

{
  int iVar1;
  FILE *__stream;
  size_t __n;
  char *__s1;
  size_t sVar2;
  long in_RDX;
  char *in_RSI;
  char *in_RDI;
  bool bVar3;
  char *buffer;
  size_t signature_len;
  bool res;
  FILE *fp;
  char *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff70;
  allocator local_49;
  string local_48 [32];
  FILE *local_28;
  long local_20;
  char *local_18;
  bool local_1;
  
  if ((in_RDI == (char *)0x0) || (in_RSI == (char *)0x0)) {
    local_1 = false;
  }
  else {
    local_20 = in_RDX;
    local_18 = in_RSI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,in_RDI,&local_49);
    __stream = (FILE *)Fopen(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    if (__stream == (FILE *)0x0) {
      local_1 = false;
    }
    else {
      local_28 = __stream;
      fseek(__stream,local_20,0);
      bVar3 = false;
      __n = strlen(local_18);
      __s1 = (char *)operator_new__(__n);
      sVar2 = fread(__s1,1,__n,local_28);
      if (sVar2 == __n) {
        iVar1 = strncmp(__s1,local_18,__n);
        bVar3 = iVar1 == 0;
      }
      if (__s1 != (char *)0x0) {
        operator_delete__(__s1);
      }
      fclose(local_28);
      local_1 = bVar3;
    }
  }
  return local_1;
}

Assistant:

bool SystemTools::FileHasSignature(const char* filename, const char* signature,
                                   long offset)
{
  if (!filename || !signature) {
    return false;
  }

  FILE* fp = Fopen(filename, "rb");
  if (!fp) {
    return false;
  }

  fseek(fp, offset, SEEK_SET);

  bool res = false;
  size_t signature_len = strlen(signature);
  char* buffer = new char[signature_len];

  if (fread(buffer, 1, signature_len, fp) == signature_len) {
    res = (!strncmp(buffer, signature, signature_len) ? true : false);
  }

  delete[] buffer;

  fclose(fp);
  return res;
}